

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O3

QSize __thiscall QTransposeProxyModel::span(QTransposeProxyModel *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  parameter_type pQVar3;
  uint extraout_var;
  ulong uVar4;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 auStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xffffffff00000000;
  uVar5 = 0xffffffff;
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(*(long *)(this + 8) + 0xd8);
  pQVar3 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(this_00);
  if ((((pQVar3 != (parameter_type)0x0) && (-1 < index->r)) && (-1 < index->c)) &&
     ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    (**(code **)(*(long *)this + 400))(auStack_48,this,index);
    iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0x2b])(pQVar1,auStack_48);
    uVar5 = (ulong)extraout_var;
    uVar4 = CONCAT44(extraout_var,iVar2) << 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar4 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

QSize QTransposeProxyModel::span(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index));
    if (!d->model || !index.isValid())
        return QSize();
    return d->model->span(mapToSource(index)).transposed();
}